

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_BMP_Image.cxx
# Opt level: O0

int read_long(FILE *fp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uchar b3;
  uchar b2;
  uchar b1;
  uchar b0;
  FILE *fp_local;
  
  iVar1 = getc((FILE *)fp);
  iVar2 = getc((FILE *)fp);
  iVar3 = getc((FILE *)fp);
  iVar4 = getc((FILE *)fp);
  return CONCAT31(CONCAT21(CONCAT11((char)iVar4,(char)iVar3),(char)iVar2),(char)iVar1);
}

Assistant:

static int			// O - 32-bit signed integer
read_long(FILE *fp) {		// I - File to read from
  unsigned char b0, b1, b2, b3;	// Bytes from file

  b0 = (uchar)getc(fp);
  b1 = (uchar)getc(fp);
  b2 = (uchar)getc(fp);
  b3 = (uchar)getc(fp);

  return ((int)(((((b3 << 8) | b2) << 8) | b1) << 8) | b0);
}